

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_div(mp_int *a,mp_int *b,mp_int *c,mp_int *d)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  mp_int *pmVar6;
  mp_int *pmVar7;
  int iVar8;
  mp_digit *pmVar9;
  long lVar10;
  ulong uVar11;
  mp_digit mVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  int b_00;
  uint uVar17;
  uint uVar18;
  int b_01;
  undefined1 auVar19 [16];
  mp_int x;
  mp_int y;
  mp_int t1;
  mp_int t2;
  mp_int t;
  mp_int local_128;
  long local_108;
  mp_int local_100;
  ulong local_e8;
  long local_e0;
  mp_int local_d8;
  int local_c0;
  uint local_bc;
  mp_int local_b8;
  long local_a0;
  int local_94;
  mp_int local_90;
  mp_digit *local_78;
  ulong local_70;
  ulong local_68;
  mp_int *local_60;
  ulong local_58;
  mp_int *local_50;
  mp_int local_48;
  
  if (b->used == 0) {
    return -3;
  }
  iVar8 = mp_cmp_mag(a,b);
  if (iVar8 == -1) {
    if (d == (mp_int *)0x0) {
      iVar8 = 0;
    }
    else {
      iVar8 = mp_copy(a,d);
    }
    if (c == (mp_int *)0x0) {
      return iVar8;
    }
    c->sign = 0;
    c->used = 0;
    if ((long)c->alloc < 1) {
      return iVar8;
    }
    memset(c->dp,0,(long)c->alloc << 3);
    return iVar8;
  }
  iVar8 = mp_init_size(&local_b8,a->used + 2);
  if (iVar8 != 0) {
    return iVar8;
  }
  local_58 = (ulong)(uint)a->used;
  local_bc = a->used + 2;
  local_b8.used = local_bc;
  local_50 = c;
  local_d8.dp = (mp_digit *)malloc(0x100);
  if (local_d8.dp == (mp_digit *)0x0) {
    iVar8 = -2;
    goto LAB_0010545b;
  }
  memset(local_d8.dp,0,0x100);
  local_d8.used = 0;
  local_d8.alloc = 0x20;
  local_d8.sign = 0;
  pmVar9 = (mp_digit *)malloc(0x100);
  local_90.dp = pmVar9;
  if (pmVar9 != (mp_digit *)0x0) {
    memset(pmVar9,0,0x100);
    pmVar6 = local_50;
    local_90.used = 0;
    local_90.alloc = 0x20;
    local_90.sign = 0;
    local_78 = pmVar9;
    iVar8 = mp_init_copy(&local_128,a);
    if (iVar8 == 0) {
      iVar8 = mp_init_copy(&local_100,b);
      if (iVar8 == 0) {
        iVar2 = a->sign;
        iVar1 = b->sign;
        b_00 = 0;
        local_100.sign = 0;
        local_128._8_8_ = local_128._8_8_ & 0xffffffff00000000;
        iVar8 = 0;
        if ((long)local_100.used != 0) {
          uVar14 = local_100.dp[(long)local_100.used + -1];
          iVar8 = 0;
          if (uVar14 != 0) {
            lVar10 = 0x3f;
            if (uVar14 != 0) {
              for (; uVar14 >> lVar10 == 0; lVar10 = lVar10 + -1) {
              }
            }
            iVar13 = (local_100.used + -1) * 0x3c - ((uint)lVar10 ^ 0x3f);
            iVar8 = iVar13 + 0x40;
            iVar13 = iVar13 + (int)((ulong)((long)iVar8 * -0x77777777) >> 0x20) + 0x40;
            iVar8 = iVar8 + ((iVar13 >> 5) - (iVar13 >> 0x1f)) * -0x3c;
          }
        }
        if (iVar8 < 0x3b) {
          b_00 = 0x3b - iVar8;
          iVar8 = mp_mul_2d(&local_128,b_00,&local_128);
          if ((iVar8 != 0) || (iVar8 = mp_mul_2d(&local_100,b_00,&local_100), iVar8 != 0))
          goto LAB_00105354;
        }
        lVar10 = (long)local_128.used;
        iVar13 = local_100.used;
        uVar14 = local_100._0_8_ & 0xffffffff;
        b_01 = local_128.used - local_100.used;
        local_94 = b_00;
        local_60 = d;
        iVar8 = mp_lshd(&local_100,b_01);
        pmVar9 = local_b8.dp;
        if (iVar8 == 0) {
          local_a0 = (long)iVar13;
          local_108 = CONCAT44(local_108._4_4_,b_01);
          local_e8 = uVar14;
          local_e0 = lVar10;
          do {
            iVar8 = mp_cmp(&local_128,&local_100);
            if (iVar8 == -1) {
              mp_rshd(&local_100,(int)local_108);
              pmVar7 = local_60;
              pmVar9 = local_b8.dp;
              uVar17 = (uint)local_e8;
              if ((int)local_e0 <= (int)uVar17) goto LAB_001057b0;
              local_68 = (ulong)~uVar17;
              local_70 = (ulong)~uVar17;
              lVar10 = local_e0;
              uVar14 = local_e8;
              goto LAB_00105500;
            }
            pmVar9[b_01] = pmVar9[b_01] + 1;
            iVar8 = mp_sub(&local_128,&local_100,&local_128);
          } while (iVar8 == 0);
        }
        goto LAB_00105354;
      }
      goto LAB_00105392;
    }
    goto LAB_001053d0;
  }
  iVar8 = -2;
  goto LAB_0010541d;
LAB_00105500:
  do {
    lVar16 = lVar10 + -1;
    if (lVar16 <= local_128.used) {
      uVar3 = local_128.dp[lVar16];
      uVar11 = 0xfffffffffffffff;
      local_e0 = lVar16;
      if (uVar3 != local_100.dp[local_a0 + -1]) {
        auVar19 = __udivti3(uVar3 << 0x3c | local_128.dp[lVar10 + -2],uVar3 >> 4,
                            local_100.dp[local_a0 + -1],0);
        uVar11 = auVar19._0_8_;
        if (0xffffffffffffffe < uVar11) {
          uVar11 = 0xfffffffffffffff;
        }
        if (auVar19._8_8_ != 0) {
          uVar11 = 0xfffffffffffffff;
        }
      }
      pmVar9[(int)local_70 + (int)lVar10] = uVar11;
      local_c0 = (int)local_68 + (int)lVar10;
      local_108 = (long)local_c0;
      pmVar9[local_108] = pmVar9[local_108] + 1 & 0xfffffffffffffff;
      do {
        uVar4 = local_d8._0_8_;
        pmVar9[local_108] = pmVar9[local_108] + 0xfffffffffffffff & 0xfffffffffffffff;
        local_d8.sign = 0;
        local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
        uVar5 = local_d8._0_8_;
        local_d8.alloc = SUB84(uVar4,4);
        lVar16 = (long)local_d8.alloc;
        local_d8._0_8_ = uVar5;
        if (0 < lVar16) {
          memset(local_d8.dp,0,lVar16 << 3);
        }
        if ((int)uVar14 < 2) {
          mVar12 = 0;
        }
        else {
          mVar12 = local_100.dp[uVar14 - 2];
        }
        *local_d8.dp = mVar12;
        local_d8.dp[1] = local_100.dp[local_a0 + -1];
        local_d8.used = 2;
        iVar8 = mp_mul_d(&local_d8,pmVar9[local_108],&local_d8);
        uVar14 = local_e8;
        if (iVar8 != 0) goto LAB_00105354;
        if (lVar10 < 3) {
          mVar12 = 0;
        }
        else {
          mVar12 = local_128.dp[lVar10 + -3];
        }
        *local_78 = mVar12;
        if (lVar10 < 2) {
          mVar12 = 0;
        }
        else {
          mVar12 = local_128.dp[lVar10 + -2];
        }
        local_78[1] = mVar12;
        local_78[2] = local_128.dp[local_e0];
        local_90.used = 3;
        iVar8 = mp_cmp_mag(&local_d8,&local_90);
      } while (iVar8 == 1);
      iVar8 = mp_mul_d(&local_100,pmVar9[local_108],&local_d8);
      if (((iVar8 != 0) || (iVar8 = mp_lshd(&local_d8,local_c0), iVar8 != 0)) ||
         (iVar8 = mp_sub(&local_128,&local_d8,&local_128), iVar8 != 0)) goto LAB_00105354;
      lVar16 = local_e0;
      uVar14 = local_e8;
      if (local_128.sign == 1) {
        iVar8 = mp_copy(&local_100,&local_d8);
        if (((iVar8 != 0) || (iVar8 = mp_lshd(&local_d8,local_c0), iVar8 != 0)) ||
           (iVar8 = mp_add(&local_128,&local_d8,&local_128), iVar8 != 0)) goto LAB_00105354;
        pmVar9[local_108] = pmVar9[local_108] + 0xfffffffffffffff & 0xfffffffffffffff;
        lVar16 = local_e0;
        uVar14 = local_e8;
      }
    }
    lVar10 = lVar16;
  } while (local_a0 < lVar16);
LAB_001057b0:
  if (local_128.used == 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = a->sign;
  }
  local_128.sign = iVar8;
  if (pmVar6 != (mp_int *)0x0) {
    uVar17 = local_bc;
    if (-2 < (int)local_58) {
      uVar14 = (ulong)local_bc;
      if (local_b8.dp[uVar14 - 1] == 0) {
        uVar15 = 1;
        if ((int)local_bc < 1) {
          uVar15 = local_bc;
        }
        do {
          uVar14 = uVar14 - 1;
          if ((int)uVar17 < 2) {
            uVar17 = 0;
            uVar18 = uVar15 - 1;
            break;
          }
          uVar17 = uVar17 - 1;
          uVar18 = uVar17;
        } while (local_b8.dp[(uVar14 & 0xffffffff) - 1] == 0);
      }
      else {
        uVar18 = local_b8.used;
      }
      local_b8.used = uVar18;
    }
    if (uVar17 == 0) {
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
    }
    local_48.dp = local_b8.dp;
    local_48.used = local_b8.used;
    local_48.alloc = local_b8.alloc;
    local_48.sign = local_b8.sign;
    local_48._12_4_ = local_b8._12_4_;
    pmVar9 = pmVar6->dp;
    uVar4._0_4_ = pmVar6->used;
    uVar4._4_4_ = pmVar6->alloc;
    uVar14 = *(ulong *)&pmVar6->sign;
    pmVar6->used = local_b8.used;
    pmVar6->alloc = local_b8.alloc;
    pmVar6->sign = local_b8.sign;
    *(undefined4 *)&pmVar6->field_0xc = local_b8._12_4_;
    pmVar6->dp = local_b8.dp;
    pmVar6->sign = (uint)(iVar2 != iVar1);
    local_b8._0_8_ = uVar4;
    local_b8._8_8_ = uVar14;
    local_b8.dp = pmVar9;
  }
  iVar8 = 0;
  if (pmVar7 != (mp_int *)0x0) {
    mp_div_2d(&local_128,local_94,&local_128,(mp_int *)0x0);
    local_48.dp = local_128.dp;
    local_48.used = local_128.used;
    local_48.alloc = local_128.alloc;
    local_48._8_8_ = local_128._8_8_;
    pmVar9 = pmVar7->dp;
    uVar5._0_4_ = pmVar7->used;
    uVar5._4_4_ = pmVar7->alloc;
    uVar14 = *(ulong *)&pmVar7->sign;
    pmVar7->used = local_128.used;
    pmVar7->alloc = local_128.alloc;
    pmVar7->sign = local_128.sign;
    *(undefined4 *)&pmVar7->field_0xc = local_128._12_4_;
    pmVar7->dp = local_128.dp;
    local_128._0_8_ = uVar5;
    local_128._8_8_ = uVar14;
    local_128.dp = pmVar9;
  }
LAB_00105354:
  if (local_100.dp != (mp_digit *)0x0) {
    if (0 < (long)local_100.used) {
      memset(local_100.dp,0,(long)local_100.used << 3);
    }
    free(local_100.dp);
    local_100.dp = (mp_digit *)0x0;
    local_100.used = 0;
    local_100.alloc = 0;
    local_100.sign = 0;
  }
LAB_00105392:
  pmVar9 = local_128.dp;
  if (local_128.dp != (mp_digit *)0x0) {
    if (0 < (long)local_128.used) {
      memset(local_128.dp,0,(long)local_128.used << 3);
    }
    free(pmVar9);
    local_128.dp = (mp_digit *)0x0;
    local_128.used = 0;
    local_128.alloc = 0;
    local_128._8_8_ = local_128._8_8_ & 0xffffffff00000000;
  }
LAB_001053d0:
  pmVar9 = local_90.dp;
  if (local_90.dp != (mp_digit *)0x0) {
    if (0 < (long)local_90.used) {
      memset(local_90.dp,0,(long)local_90.used << 3);
    }
    free(pmVar9);
    local_90.dp = (mp_digit *)0x0;
    local_90.used = 0;
    local_90.alloc = 0;
    local_90.sign = 0;
  }
LAB_0010541d:
  pmVar9 = local_d8.dp;
  if (local_d8.dp != (mp_digit *)0x0) {
    if (0 < (long)local_d8.used) {
      memset(local_d8.dp,0,(long)local_d8.used << 3);
    }
    free(pmVar9);
    local_d8.dp = (mp_digit *)0x0;
    local_d8.used = 0;
    local_d8.alloc = 0;
    local_d8.sign = 0;
  }
LAB_0010545b:
  pmVar9 = local_b8.dp;
  if (local_b8.dp != (mp_digit *)0x0) {
    if (0 < (long)local_b8.used) {
      memset(local_b8.dp,0,(long)local_b8.used << 3);
    }
    free(pmVar9);
  }
  return iVar8;
}

Assistant:

int mp_div (mp_int * a, mp_int * b, mp_int * c, mp_int * d)
{
  mp_int  q, x, y, t1, t2;
  int     res, n, t, i, norm, neg;

  /* is divisor zero ? */
  if (mp_iszero (b) == 1) {
    return MP_VAL;
  }

  /* if a < b then q=0, r = a */
  if (mp_cmp_mag (a, b) == MP_LT) {
    if (d != NULL) {
      res = mp_copy (a, d);
    } else {
      res = MP_OKAY;
    }
    if (c != NULL) {
      mp_zero (c);
    }
    return res;
  }

  if ((res = mp_init_size (&q, a->used + 2)) != MP_OKAY) {
    return res;
  }
  q.used = a->used + 2;

  if ((res = mp_init (&t1)) != MP_OKAY) {
    goto LBL_Q;
  }

  if ((res = mp_init (&t2)) != MP_OKAY) {
    goto LBL_T1;
  }

  if ((res = mp_init_copy (&x, a)) != MP_OKAY) {
    goto LBL_T2;
  }

  if ((res = mp_init_copy (&y, b)) != MP_OKAY) {
    goto LBL_X;
  }

  /* fix the sign */
  neg = (a->sign == b->sign) ? MP_ZPOS : MP_NEG;
  x.sign = y.sign = MP_ZPOS;

  /* normalize both x and y, ensure that y >= b/2, [b == 2**DIGIT_BIT] */
  norm = mp_count_bits(&y) % DIGIT_BIT;
  if (norm < (int)(DIGIT_BIT-1)) {
     norm = (DIGIT_BIT-1) - norm;
     if ((res = mp_mul_2d (&x, norm, &x)) != MP_OKAY) {
       goto LBL_Y;
     }
     if ((res = mp_mul_2d (&y, norm, &y)) != MP_OKAY) {
       goto LBL_Y;
     }
  } else {
     norm = 0;
  }

  /* note hac does 0 based, so if used==5 then its 0,1,2,3,4, e.g. use 4 */
  n = x.used - 1;
  t = y.used - 1;

  /* while (x >= y*b**n-t) do { q[n-t] += 1; x -= y*b**{n-t} } */
  if ((res = mp_lshd (&y, n - t)) != MP_OKAY) { /* y = y*b**{n-t} */
    goto LBL_Y;
  }

  while (mp_cmp (&x, &y) != MP_LT) {
    ++(q.dp[n - t]);
    if ((res = mp_sub (&x, &y, &x)) != MP_OKAY) {
      goto LBL_Y;
    }
  }

  /* reset y by shifting it back down */
  mp_rshd (&y, n - t);

  /* step 3. for i from n down to (t + 1) */
  for (i = n; i >= (t + 1); i--) {
    if (i > x.used) {
      continue;
    }

    /* step 3.1 if xi == yt then set q{i-t-1} to b-1, 
     * otherwise set q{i-t-1} to (xi*b + x{i-1})/yt */
    if (x.dp[i] == y.dp[t]) {
      q.dp[i - t - 1] = ((((mp_digit)1) << DIGIT_BIT) - 1);
    } else {
      mp_word tmp;
      tmp = ((mp_word) x.dp[i]) << ((mp_word) DIGIT_BIT);
      tmp |= ((mp_word) x.dp[i - 1]);
      tmp /= ((mp_word) y.dp[t]);
      if (tmp > (mp_word) MP_MASK)
        tmp = MP_MASK;
      q.dp[i - t - 1] = (mp_digit) (tmp & (mp_word) (MP_MASK));
    }

    /* while (q{i-t-1} * (yt * b + y{t-1})) > 
             xi * b**2 + xi-1 * b + xi-2 
     
       do q{i-t-1} -= 1; 
    */
    q.dp[i - t - 1] = (q.dp[i - t - 1] + 1) & MP_MASK;
    do {
      q.dp[i - t - 1] = (q.dp[i - t - 1] - 1) & MP_MASK;

      /* find left hand */
      mp_zero (&t1);
      t1.dp[0] = (t - 1 < 0) ? 0 : y.dp[t - 1];
      t1.dp[1] = y.dp[t];
      t1.used = 2;
      if ((res = mp_mul_d (&t1, q.dp[i - t - 1], &t1)) != MP_OKAY) {
        goto LBL_Y;
      }

      /* find right hand */
      t2.dp[0] = (i - 2 < 0) ? 0 : x.dp[i - 2];
      t2.dp[1] = (i - 1 < 0) ? 0 : x.dp[i - 1];
      t2.dp[2] = x.dp[i];
      t2.used = 3;
    } while (mp_cmp_mag(&t1, &t2) == MP_GT);

    /* step 3.3 x = x - q{i-t-1} * y * b**{i-t-1} */
    if ((res = mp_mul_d (&y, q.dp[i - t - 1], &t1)) != MP_OKAY) {
      goto LBL_Y;
    }

    if ((res = mp_lshd (&t1, i - t - 1)) != MP_OKAY) {
      goto LBL_Y;
    }

    if ((res = mp_sub (&x, &t1, &x)) != MP_OKAY) {
      goto LBL_Y;
    }

    /* if x < 0 then { x = x + y*b**{i-t-1}; q{i-t-1} -= 1; } */
    if (x.sign == MP_NEG) {
      if ((res = mp_copy (&y, &t1)) != MP_OKAY) {
        goto LBL_Y;
      }
      if ((res = mp_lshd (&t1, i - t - 1)) != MP_OKAY) {
        goto LBL_Y;
      }
      if ((res = mp_add (&x, &t1, &x)) != MP_OKAY) {
        goto LBL_Y;
      }

      q.dp[i - t - 1] = (q.dp[i - t - 1] - 1UL) & MP_MASK;
    }
  }

  /* now q is the quotient and x is the remainder 
   * [which we have to normalize] 
   */
  
  /* get sign before writing to c */
  x.sign = x.used == 0 ? MP_ZPOS : a->sign;

  if (c != NULL) {
    mp_clamp (&q);
    mp_exch (&q, c);
    c->sign = neg;
  }

  if (d != NULL) {
    mp_div_2d (&x, norm, &x, NULL);
    mp_exch (&x, d);
  }

  res = MP_OKAY;

LBL_Y:mp_clear (&y);
LBL_X:mp_clear (&x);
LBL_T2:mp_clear (&t2);
LBL_T1:mp_clear (&t1);
LBL_Q:mp_clear (&q);
  return res;
}